

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O3

string * testing::internal::StreamableToString<long_long>
                   (string *__return_storage_ptr__,longlong *streamable)

{
  long in_FS_OFFSET;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message((Message *)&local_28);
  std::ostream::_M_insert<long_long>((longlong)(local_28.ptr_ + 0x10));
  StringStreamToString(__return_storage_ptr__,local_28.ptr_);
  if (local_28.ptr_ == (stringstream *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_001645a6;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_001645a6:
      __stack_chk_fail();
    }
    (**(code **)(*(long *)local_28.ptr_ + 8))(local_28.ptr_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}